

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::BrS(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,byte val)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_2b;
  byte local_29;
  undefined8 uStack_28;
  OpLayoutBrS data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  ByteCodeLabel local_18;
  OpCode OStack_12;
  byte val_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  offsetOfRelativeJumpOffsetFromEnd._7_1_ = val;
  local_18 = labelID;
  OStack_12 = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = OStack_12;
  OpLayoutType::OpLayoutType((OpLayoutType *)&offsetOfRelativeJumpOffsetFromEnd,BrS);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._0_4_);
  CheckLabel(this,local_18);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(OStack_12);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x313,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uStack_28 = 3;
  local_2b = 3;
  local_29 = offsetOfRelativeJumpOffsetFromEnd._7_1_;
  Data::Encode(&this->m_byteCodeData,OStack_12,&local_2b,3,this);
  AddJumpOffset(this,OStack_12,local_18,3);
  return;
}

Assistant:

void ByteCodeWriter::BrS(OpCode op, ByteCodeLabel labelID, byte val)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrS);
        CheckLabel(labelID);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrS) - offsetof(OpLayoutBrS, RelativeJumpOffset);
        OpLayoutBrS data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.val = val;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }